

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O2

double __thiscall
brotli::ZopfliCostModel::GetCommandCost
          (ZopfliCostModel *this,size_t dist_code,size_t length_code,size_t insert_length)

{
  uint16_t inscode;
  uint16_t copycode;
  uint16_t uVar1;
  ulong in_RAX;
  double dVar2;
  uint16_t dist_symbol;
  uint32_t distextra;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  inscode = GetInsertLengthCode(insert_length);
  copycode = GetCopyLengthCode(length_code);
  uVar1 = CombineLengthCodes(inscode,copycode,dist_code == 0);
  PrefixEncodeCopyDistance
            (dist_code,0,0,(uint16_t *)((long)&uStack_38 + 2),(uint32_t *)((long)&uStack_38 + 4));
  dVar2 = (double)((uint)uStack_38._7_1_ + *(int *)(kInsExtra + (ulong)inscode * 4) +
                  *(int *)(kCopyExtra + (ulong)copycode * 4)) +
          (this->cost_cmd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1];
  if (0x7f < uVar1) {
    dVar2 = dVar2 + (this->cost_dist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uStack_38 >> 0x10 & 0xffff];
  }
  return dVar2;
}

Assistant:

double GetCommandCost(
      size_t dist_code, size_t length_code, size_t insert_length) const {
    uint16_t inscode = GetInsertLengthCode(insert_length);
    uint16_t copycode = GetCopyLengthCode(length_code);
    uint16_t cmdcode = CombineLengthCodes(inscode, copycode, dist_code == 0);
    uint16_t dist_symbol;
    uint32_t distextra;
    PrefixEncodeCopyDistance(dist_code, 0, 0, &dist_symbol, &distextra);
    uint32_t distnumextra = distextra >> 24;

    double result =  static_cast<double>(
        kInsExtra[inscode] + kCopyExtra[copycode] + distnumextra);
    result += cost_cmd_[cmdcode];
    if (cmdcode >= 128) result += cost_dist_[dist_symbol];
    return result;
  }